

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteToConsoleListener.cpp
# Opt level: O2

void __thiscall
Common::WriteToConsoleListener::~WriteToConsoleListener(WriteToConsoleListener *this)

{
  ~WriteToConsoleListener(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

WriteToConsoleListener::~WriteToConsoleListener()
{
    auto lock = std::lock_guard(_mutex);
    std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
}